

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  ZSTD_compressionParameters *cParams;
  BYTE *pInLimit;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  uint uVar6;
  uint uVar7;
  U32 UVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int *ip_00;
  bool bVar22;
  uint local_ac;
  int *local_90;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar17 = (ms->window).base + (ms->window).dictLimit;
  uVar2 = *rep;
  uVar3 = rep[1];
  iVar20 = (int)pBVar17;
  ip_00 = (int *)((ulong)((int)src == iVar20) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar6 = (int)ip_00 - iVar20;
  local_ac = uVar3;
  if (uVar6 < uVar3) {
    local_ac = 0;
  }
  uVar10 = (ulong)uVar2;
  if (uVar6 < uVar2) {
    uVar10 = 0;
  }
  cParams = &ms->cParams;
  do {
    uVar16 = (uint)uVar10;
    lVar14 = -uVar10;
    while( true ) {
      if (piVar1 <= ip_00) {
        uVar9 = 0;
        if (uVar6 < uVar3) {
          uVar9 = uVar3;
        }
        if (uVar6 < uVar2) {
          uVar9 = uVar2;
        }
        if (uVar16 == 0) {
          uVar16 = uVar9;
        }
        if (local_ac != 0) {
          uVar9 = local_ac;
        }
        *rep = uVar16;
        rep[1] = uVar9;
        return (long)pInLimit - (long)src;
      }
      if (uVar16 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        if (*(int *)((long)ip_00 + lVar14 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar11 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar14 + 5),pInLimit)
          ;
          uVar10 = sVar11 + 4;
        }
      }
      uVar9 = (ms->cParams).minMatch;
      iVar20 = (int)ip_00;
      if (uVar9 - 6 < 2) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar21 = iVar20 - (int)pBVar5;
        uVar13 = uVar21 - uVar7;
        if (uVar21 < uVar7) {
          uVar13 = 0;
        }
        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
        uVar15 = 999999999;
        uVar12 = 3;
        while( true ) {
          bVar22 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if ((((UVar8 <= uVar9) || (bVar22)) ||
              ((pBVar18 = pBVar5 + UVar8, pBVar18[uVar12] == *(BYTE *)((long)ip_00 + uVar12) &&
               ((sVar11 = ZSTD_count((BYTE *)ip_00,pBVar18,pInLimit), uVar12 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar8), uVar12 = sVar11,
                (BYTE *)(sVar11 + (long)ip_00) == pInLimit)))))) || (UVar8 <= uVar13)) break;
          UVar8 = pUVar4[UVar8 & uVar7 - 1];
        }
      }
      else if (uVar9 == 5) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar21 = iVar20 - (int)pBVar5;
        uVar13 = uVar21 - uVar7;
        if (uVar21 < uVar7) {
          uVar13 = 0;
        }
        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
        uVar15 = 999999999;
        uVar12 = 3;
        while( true ) {
          bVar22 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if (((UVar8 <= uVar9) || (bVar22)) ||
             (((pBVar18 = pBVar5 + UVar8, pBVar18[uVar12] == *(BYTE *)((long)ip_00 + uVar12) &&
               ((sVar11 = ZSTD_count((BYTE *)ip_00,pBVar18,pInLimit), uVar12 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar8), uVar12 = sVar11,
                (BYTE *)(sVar11 + (long)ip_00) == pInLimit)))) || (UVar8 <= uVar13)))) break;
          UVar8 = pUVar4[UVar8 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar21 = iVar20 - (int)pBVar5;
        uVar13 = uVar21 - uVar7;
        if (uVar21 < uVar7) {
          uVar13 = 0;
        }
        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
        uVar15 = 999999999;
        uVar12 = 3;
        while( true ) {
          bVar22 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if ((((UVar8 <= uVar9) || (bVar22)) ||
              ((pBVar18 = pBVar5 + UVar8, pBVar18[uVar12] == *(BYTE *)((long)ip_00 + uVar12) &&
               ((sVar11 = ZSTD_count((BYTE *)ip_00,pBVar18,pInLimit), uVar12 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar8), uVar12 = sVar11,
                (BYTE *)(sVar11 + (long)ip_00) == pInLimit)))))) || (UVar8 <= uVar13)) break;
          UVar8 = pUVar4[UVar8 & uVar7 - 1];
        }
      }
      uVar19 = uVar10;
      if (uVar10 < uVar12) {
        uVar19 = uVar12;
      }
      if (3 < uVar19) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    if (uVar12 <= uVar10) {
      uVar15 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    if (uVar10 < uVar12) {
      ip = ip_00;
    }
    do {
      local_90 = ip;
      uVar10 = uVar19;
      uVar12 = uVar15;
      if (piVar1 <= ip_00) break;
      ip = (int *)((long)ip_00 + 1);
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else if ((uVar16 != 0) && (*ip == *(int *)((long)ip + lVar14))) {
        sVar11 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar14 + 5),pInLimit);
        if (sVar11 < 0xfffffffffffffffc) {
          uVar13 = (int)uVar12 + 1;
          uVar9 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
            uVar12 = 0;
            uVar10 = sVar11 + 4;
            local_90 = ip;
          }
        }
      }
      uVar9 = (ms->cParams).minMatch;
      iVar20 = (int)ip;
      if (uVar9 - 6 < 2) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar21 = iVar20 - (int)pBVar5;
        uVar13 = uVar21 - uVar7;
        if (uVar21 < uVar7) {
          uVar13 = 0;
        }
        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        uVar15 = 999999999;
        uVar19 = 3;
        while( true ) {
          bVar22 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if ((((UVar8 <= uVar9) || (bVar22)) ||
              ((pBVar18 = pBVar5 + UVar8, pBVar18[uVar19] == *(BYTE *)((long)ip + uVar19) &&
               ((sVar11 = ZSTD_count((BYTE *)ip,pBVar18,pInLimit), uVar19 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar8), uVar19 = sVar11,
                (BYTE *)(sVar11 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar13)) break;
          UVar8 = pUVar4[UVar8 & uVar7 - 1];
        }
      }
      else if (uVar9 == 5) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar21 = iVar20 - (int)pBVar5;
        uVar13 = uVar21 - uVar7;
        if (uVar21 < uVar7) {
          uVar13 = 0;
        }
        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        uVar15 = 999999999;
        uVar19 = 3;
        while( true ) {
          bVar22 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if ((((UVar8 <= uVar9) || (bVar22)) ||
              ((pBVar18 = pBVar5 + UVar8, pBVar18[uVar19] == *(BYTE *)((long)ip + uVar19) &&
               ((sVar11 = ZSTD_count((BYTE *)ip,pBVar18,pInLimit), uVar19 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar8), uVar19 = sVar11,
                (BYTE *)(sVar11 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar13)) break;
          UVar8 = pUVar4[UVar8 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar21 = iVar20 - (int)pBVar5;
        uVar13 = uVar21 - uVar7;
        if (uVar21 < uVar7) {
          uVar13 = 0;
        }
        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        uVar15 = 999999999;
        uVar19 = 3;
        while( true ) {
          bVar22 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if ((((UVar8 <= uVar9) || (bVar22)) ||
              ((pBVar18 = pBVar5 + UVar8, pBVar18[uVar19] == *(BYTE *)((long)ip + uVar19) &&
               ((sVar11 = ZSTD_count((BYTE *)ip,pBVar18,pInLimit), uVar19 < sVar11 &&
                (uVar15 = (ulong)((uVar21 + 2) - UVar8), uVar19 = sVar11,
                (BYTE *)(sVar11 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar13)) break;
          UVar8 = pUVar4[UVar8 & uVar7 - 1];
        }
      }
      if (uVar19 < 4) break;
      uVar13 = (int)uVar12 + 1;
      uVar9 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar13 = (int)uVar15 + 1;
      iVar20 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      ip_00 = ip;
    } while ((int)((uVar9 ^ 0x1f) + (int)uVar10 * 4 + -0x1b) < (int)uVar19 * 4 - iVar20);
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      for (; ((src < local_90 && (pBVar17 < (BYTE *)((long)local_90 + (2 - uVar12)))) &&
             (*(BYTE *)((long)local_90 + -1) == *(BYTE *)((long)local_90 + (1 - uVar12))));
          local_90 = (int *)((long)local_90 + -1)) {
        uVar10 = uVar10 + 1;
      }
      local_ac = uVar16;
      uVar16 = (int)uVar12 - 2;
    }
    ZSTD_storeSeq(seqStore,(long)local_90 - (long)src,src,(U32)uVar12,uVar10 - 3);
    uVar9 = local_ac;
    for (src = (void *)((long)local_90 + uVar10);
        ((local_ac = uVar9, uVar10 = (ulong)uVar16, ip_00 = (int *)src, local_ac != 0 &&
         (src <= piVar1)) && (*src == *(int *)((long)src - (ulong)local_ac)));
        src = (void *)((long)src + sVar11 + 4)) {
      sVar11 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_ac)),
                          pInLimit);
      ZSTD_storeSeq(seqStore,0,src,0,sVar11 + 1);
      uVar9 = uVar16;
      uVar16 = local_ac;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_noDict);
}